

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::TPZCompElHCurl(TPZCompElHCurl<pzshape::TPZShapeCube> *this)

{
  long *plVar1;
  long lVar2;
  long local_20;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_017810b0;
  TPZIntelGen<pzshape::TPZShapeCube>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeCube>,&PTR_PTR_0177cba0);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHCurl_0177c7d0;
  local_20 = -1;
  TPZManVector<long,_19>::TPZManVector(&this->fConnectIndexes,0x13,&local_20);
  this->fhcurlfam = EHCurlStandard;
  (this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = -1;
  plVar1 = (this->fConnectIndexes).super_TPZVec<long>.fStore;
  for (lVar2 = 0; lVar2 != 0x13; lVar2 = lVar2 + 1) {
    plVar1[lVar2] = -1;
  }
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::TPZCompElHCurl() :
TPZRegisterClassId(&TPZCompElHCurl::ClassId),
TPZIntelGen<TSHAPE>()
{
	this->fPreferredOrder = -1;
	int i;
	for(i=0;i<TSHAPE::NSides-TSHAPE::NCornerNodes;i++) {
		this-> fConnectIndexes[i] = -1;
	}

}